

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedSyncImageAccess::Run(AdvancedSyncImageAccess *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int h;
  vec4 *expected;
  undefined8 local_28;
  undefined8 uStack_20;
  
  bVar1 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,1);
  lVar5 = 0x10;
  if (bVar1) {
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nwriteonly uniform imageBuffer g_output_data;\nvoid main() {\n  vec2[4] data = vec2[4](vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1));\n  imageStore(g_output_data, gl_VertexID, vec4(data[gl_VertexID], 0.0, 1.0));\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    this->m_store_program = GVar2;
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nout vec4 vs_color;\nlayout(rg32f) readonly uniform imageBuffer g_image;\nuniform samplerBuffer g_sampler;\nvoid main() {\n  vec4 pi = imageLoad(g_image, gl_VertexID);\n  vec4 ps = texelFetch(g_sampler, gl_VertexID);\n  if (pi != ps) vs_color = vec4(1.0, 0.0, 0.0, 1.0);\n  else vs_color = vec4(0.0, 1.0, 0.0, 1.0);\n  gl_Position = pi;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,
                       "#version 420 core\nin vec4 vs_color;\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vs_color;\n}"
                       ,(bool *)0x0);
    this->m_draw_program = GVar2;
    this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_attribless_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_attribless_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x20,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_buffer_tex);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_buffer_tex);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8230,this->m_buffer);
    h = 0;
    expected = (vec4 *)0x0;
    glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_buffer_tex,0,'\0',0,0x88ba,0x8230);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_store_program);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x28);
    glu::CallLogWrapper::glDisable(this_00,0x8c89);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    iVar3 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
    iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_28 = 0x3f80000000000000;
    uStack_20 = 0x3f80000000000000;
    bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&this->super_ShaderImageLoadStoreBase,iVar3,
                       *(int *)(CONCAT44(extraout_var_00,iVar4) + 4),(int)&local_28,h,expected);
    lVar5 = (ulong)bVar1 - 1;
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;
		const char* const glsl_store_vs =
			"#version 420 core" NL "writeonly uniform imageBuffer g_output_data;" NL "void main() {" NL
			"  vec2[4] data = vec2[4](vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1));" NL
			"  imageStore(g_output_data, gl_VertexID, vec4(data[gl_VertexID], 0.0, 1.0));" NL "}";
		const char* const glsl_draw_vs =
			"#version 420 core" NL "out vec4 vs_color;" NL "layout(rg32f) readonly uniform imageBuffer g_image;" NL
			"uniform samplerBuffer g_sampler;" NL "void main() {" NL "  vec4 pi = imageLoad(g_image, gl_VertexID);" NL
			"  vec4 ps = texelFetch(g_sampler, gl_VertexID);" NL
			"  if (pi != ps) vs_color = vec4(1.0, 0.0, 0.0, 1.0);" NL "  else vs_color = vec4(0.0, 1.0, 0.0, 1.0);" NL
			"  gl_Position = pi;" NL "}";
		const char* const glsl_draw_fs =
			"#version 420 core" NL "in vec4 vs_color;" NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
			"  o_color = vs_color;" NL "}";
		m_store_program = BuildProgram(glsl_store_vs, NULL, NULL, NULL, NULL);
		m_draw_program  = BuildProgram(glsl_draw_vs, NULL, NULL, NULL, glsl_draw_fs);

		glGenVertexArrays(1, &m_attribless_vao);
		glBindVertexArray(m_attribless_vao);

		glGenBuffers(1, &m_buffer);
		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glBufferData(GL_TEXTURE_BUFFER, sizeof(vec2) * 4, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);

		glGenTextures(1, &m_buffer_tex);
		glBindTexture(GL_TEXTURE_BUFFER, m_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RG32F, m_buffer);

		glBindImageTexture(0, m_buffer_tex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RG32F);

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_store_program);
		glDrawArrays(GL_POINTS, 0, 4);

		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT | GL_TEXTURE_FETCH_BARRIER_BIT);

		glDisable(GL_RASTERIZER_DISCARD);
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_draw_program);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}